

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,QStringView string)

{
  QTextStreamPrivate *len;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  char *in_stack_ffffffffffffff98;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QTextStream *data;
  QTextStreamPrivate *in_stack_ffffffffffffffc0;
  QMessageLogger local_38;
  QStringView local_18;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  len = d_func((QTextStream *)0x4accf4);
  if ((len->string == (QString *)0x0) && (len->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line,in_stack_ffffffffffffff88);
    QMessageLogger::warning(&local_38,"QTextStream: No device");
  }
  else {
    QStringView::cbegin((QStringView *)0x4acd58);
    QStringView::size(&local_18);
    QTextStreamPrivate::putString
              (in_stack_ffffffffffffffc0,(QChar *)data,(qsizetype)len,SUB81((ulong)in_RDI >> 0x38,0)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(QStringView string)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putString(string.cbegin(), string.size());
    return *this;
}